

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase555::run(TestCase555 *this)

{
  NullableValue<kj::OwnFd> NVar1;
  SourceLocation location;
  int iVar2;
  int osErrorNumber;
  ssize_t sVar3;
  void *pvVar4;
  undefined8 extraout_RAX;
  void **ppvVar5;
  char *pcVar6;
  nfds_t __nfds;
  nfds_t __nfds_00;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:577:13)>
  *location_00;
  pollfd *ppVar7;
  bool writable;
  OwnFd outfd;
  OwnFd infd;
  Fault f_2;
  undefined1 local_1258 [8];
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1250;
  anon_class_8_1_79db791e_for_func local_1248;
  Promise<void> promise;
  int pipefds [2];
  WaitScope waitScope;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_11f8;
  EventLoop loop;
  FdObserver observer;
  UnixEventPort port;
  char buffer [4096];
  
  captureSignals();
  UnixEventPort::UnixEventPort(&port);
  EventLoop::EventLoop(&loop,&port.super_EventPort);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  pipefds[0] = 0;
  pipefds[1] = 0;
  do {
    iVar2 = ::pipe(pipefds);
    if (-1 < iVar2) goto LAB_001cc113;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)buffer,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x232,iVar2,"pipe(pipefds)","");
    kj::_::Debug::Fault::fatal((Fault *)buffer);
  }
LAB_001cc113:
  infd.fd = pipefds[0];
  outfd.fd = pipefds[1];
  setNonblocking(pipefds[1]);
  setNonblocking(infd.fd);
  UnixEventPort::FdObserver::FdObserver(&observer,&port,outfd.fd,2);
  do {
    do {
      sVar3 = ::write(outfd.fd,"foo",3);
    } while (-1 < sVar3);
    iVar2 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)buffer,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x23c,iVar2,"n = write(outfd, \"foo\", 3)","");
    kj::_::Debug::Fault::fatal((Fault *)buffer);
  }
  writable = false;
  UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_1258);
  buffer._0_8_ = kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:577:13)>
                 ::anon_class_8_1_79db791e_for_func::operator();
  NVar1 = (NullableValue<kj::OwnFd>)
          ((SleepHooks *)&((PromiseArenaMember *)local_1258)->arena)->_vptr_SleepHooks;
  local_1248.writable = &writable;
  if (NVar1 == (NullableValue<kj::OwnFd>)0x0 || (ulong)((long)local_1258 - (long)NVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:577:13)>
                   *)((long)pvVar4 + 0x3d8);
    ppvVar5 = (void **)buffer;
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase555::run()::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase555::run()::__2,void*&>
              (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_1258,&local_1248
               ,ppvVar5);
    iVar2 = (int)ppvVar5;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    ((SleepHooks *)&((PromiseArenaMember *)local_1258)->arena)->_vptr_SleepHooks = (_func_int **)0x0
    ;
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:577:13)>
                   *)((unsigned_long *)((long)local_1258 + -0x30) + 1);
    ppvVar5 = (void **)buffer;
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase555::run()::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase555::run()::__2,void*&>
              (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_1258,&local_1248
               ,ppvVar5);
    iVar2 = (int)ppvVar5;
    ((Maybe<kj::OwnFd> *)((long)local_1258 + -0x20))->ptr = NVar1;
  }
  f_2.exception = (Exception *)0x0;
  local_11f8.ptr = (PromiseNode *)0x0;
  local_1250.ptr = (PromiseNode *)location_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_11f8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f_2);
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  location.lineNumber = 0x240;
  location.columnNumber = 0x12;
  Promise<void>::eagerlyEvaluate(&promise,&local_1250,location);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1250);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_1258);
  ppVar7 = (pollfd *)0xffffffffffffffff;
  EventLoop::run(&loop,0xffffffff);
  UnixEventPort::poll(&port,ppVar7,__nfds,iVar2);
  EventLoop::run(&loop,0xffffffff);
  pcVar6 = (char *)(CONCAT71((int7)((ulong)extraout_RAX >> 8),writable) & 0xffffffff ^ 1);
  buffer[0] = (char)pcVar6;
  if ((writable != false) && (kj::_::Debug::minSeverity < 3)) {
    pcVar6 = "\"failed: expected \" \"!(writable)\", _kjCondition";
    kj::_::Debug::log<char_const(&)[29],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x247,ERROR,"\"failed: expected \" \"!(writable)\", _kjCondition",
               (char (*) [29])"failed: expected !(writable)",(DebugExpression<bool> *)buffer);
  }
  memset(buffer,0,0x1000);
  do {
    while( true ) {
      sVar3 = read(infd.fd,buffer,0x1000);
      iVar2 = (int)pcVar6;
      if (sVar3 < 0) break;
      if (sVar3 == 0) {
LAB_001cc376:
        ppVar7 = (pollfd *)0xffffffffffffffff;
        EventLoop::run(&loop,0xffffffff);
        UnixEventPort::poll(&port,ppVar7,__nfds_00,iVar2);
        EventLoop::run(&loop,0xffffffff);
        f_2.exception = (Exception *)&writable;
        if ((writable == false) && (kj::_::Debug::minSeverity < 3)) {
          kj::_::Debug::log<char_const(&)[26],kj::_::DebugExpression<bool&>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                     ,0x256,ERROR,"\"failed: expected \" \"writable\", _kjCondition",
                     (char (*) [26])"failed: expected writable",(DebugExpression<bool_&> *)&f_2);
        }
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
        UnixEventPort::FdObserver::~FdObserver(&observer);
        OwnFd::~OwnFd(&outfd);
        OwnFd::~OwnFd(&infd);
        WaitScope::~WaitScope(&waitScope);
        EventLoop::~EventLoop(&loop);
        UnixEventPort::~UnixEventPort(&port);
        return;
      }
    }
    osErrorNumber = kj::_::Debug::getOsErrorNumber(true);
    iVar2 = (int)pcVar6;
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    kj::_::Debug::Fault::Fault
              (&f_2,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x24f,osErrorNumber,"n = read(infd, &buffer, sizeof(buffer))","");
    kj::_::Debug::Fault::fatal(&f_2);
  }
  goto LAB_001cc376;
}

Assistant:

TEST(AsyncUnixTest, WriteObserver) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  int pipefds[2]{};
  KJ_SYSCALL(pipe(pipefds));
  kj::OwnFd infd(pipefds[0]), outfd(pipefds[1]);
  setNonblocking(outfd);
  setNonblocking(infd);

  UnixEventPort::FdObserver observer(port, outfd, UnixEventPort::FdObserver::OBSERVE_WRITE);

  // Fill buffer.
  ssize_t n;
  do {
    KJ_NONBLOCKING_SYSCALL(n = write(outfd, "foo", 3));
  } while (n >= 0);

  bool writable = false;
  auto promise = observer.whenBecomesWritable()
      .then([&]() { writable = true; }).eagerlyEvaluate(nullptr);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_FALSE(writable);

  // Empty the read end so that the write end becomes writable. Note that Linux implements a
  // high watermark / low watermark heuristic which means that only reading one byte is not
  // sufficient. The amount we have to read is in fact architecture-dependent -- it appears to be
  // 1 page. To be safe, we read everything.
  char buffer[4096]{};
  do {
    KJ_NONBLOCKING_SYSCALL(n = read(infd, &buffer, sizeof(buffer)));
  } while (n > 0);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_TRUE(writable);
}